

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime * __thiscall QDateTime::operator=(QDateTime *this,QDateTime *other)

{
  Data::operator=((Data *)this,&other->d);
  return this;
}

Assistant:

QDateTime &QDateTime::operator=(const QDateTime &other) noexcept
{
    d = other.d;
    return *this;
}